

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscopedpointer.h
# Opt level: O3

int __thiscall QLocalSocket::close(QLocalSocket *this,int __fd)

{
  QLocalSocketPrivate *this_00;
  QArrayData *pQVar1;
  int extraout_EAX;
  int iVar2;
  
  this_00 = *(QLocalSocketPrivate **)&this->field_0x8;
  QIODevice::close();
  QAbstractSocket::close((QAbstractSocket *)&this_00->unixSocket,__fd);
  QLocalSocketPrivate::cancelDelayedConnect(this_00);
  iVar2 = extraout_EAX;
  if (this_00->connectingSocket != -1) {
    iVar2 = ::close(this_00->connectingSocket);
  }
  this_00->connectingSocket = -1;
  if ((this_00->connectingName).d.ptr != (char16_t *)0x0) {
    pQVar1 = &((this_00->connectingName).d.d)->super_QArrayData;
    (this_00->connectingName).d.d = (Data *)0x0;
    (this_00->connectingName).d.ptr = (char16_t *)0x0;
    (this_00->connectingName).d.size = 0;
    if (pQVar1 != (QArrayData *)0x0) {
      LOCK();
      (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        iVar2 = QArrayData::deallocate(pQVar1,2,0x10);
      }
    }
  }
  (this_00->connectingOpenMode).super_QFlagsStorageHelper<QIODeviceBase::OpenModeFlag,_4>.
  super_QFlagsStorage<QIODeviceBase::OpenModeFlag>.i = 0;
  if ((this_00->serverName).d.ptr != (char16_t *)0x0) {
    pQVar1 = &((this_00->serverName).d.d)->super_QArrayData;
    (this_00->serverName).d.d = (Data *)0x0;
    (this_00->serverName).d.ptr = (char16_t *)0x0;
    (this_00->serverName).d.size = 0;
    if (pQVar1 != (QArrayData *)0x0) {
      LOCK();
      (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        iVar2 = QArrayData::deallocate(pQVar1,2,0x10);
      }
    }
  }
  if ((this_00->fullServerName).d.ptr != (char16_t *)0x0) {
    pQVar1 = &((this_00->fullServerName).d.d)->super_QArrayData;
    (this_00->fullServerName).d.d = (Data *)0x0;
    (this_00->fullServerName).d.ptr = (char16_t *)0x0;
    (this_00->fullServerName).d.size = 0;
    if (pQVar1 != (QArrayData *)0x0) {
      LOCK();
      (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        iVar2 = QArrayData::deallocate(pQVar1,2,0x10);
        return iVar2;
      }
    }
  }
  return iVar2;
}

Assistant:

T *get() const noexcept
    {
        return d;
    }